

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

SPIRType * __thiscall
spirv_cross::Compiler::get_variable_data_type(Compiler *this,SPIRVariable *var)

{
  uint32_t type_id;
  SPIRType *pSVar1;
  
  type_id = *(uint32_t *)&(var->super_IVariant).field_0xc;
  if ((var->phi_variable == false) && (var->storage != AtomicCounter)) {
    type_id = get_pointee_type_id(this,type_id);
  }
  pSVar1 = Variant::get<spirv_cross::SPIRType>
                     ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + type_id);
  return pSVar1;
}

Assistant:

const SPIRType &Compiler::get_variable_data_type(const SPIRVariable &var) const
{
	return get<SPIRType>(get_variable_data_type_id(var));
}